

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall FloatInterval_SumSquares_Test::TestBody(FloatInterval_SumSquares_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  float fVar5;
  float *__result_1;
  long lVar6;
  float *pfVar7;
  float fVar8;
  float *__result;
  internal *this_00;
  char *pcVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  AssertHelper local_40;
  undefined8 local_38;
  float fStack_30;
  float fStack_2c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_20.ptr_._0_4_ = 1;
  local_40.data_._0_4_ = 1.0;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_38,"1","Float(SumSquares(a))",(int *)&local_20,(float *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if ((undefined8 *)CONCAT44(fStack_2c,fStack_30) == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)CONCAT44(fStack_2c,fStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x316,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_20.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_20.ptr_ + 8))();
      }
      local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&fStack_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ptr_._0_4_ = 4;
  local_40.data_._0_4_ = 4.0;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_38,"4","Float(SumSquares(b))",(int *)&local_20,(float *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if ((undefined8 *)CONCAT44(fStack_2c,fStack_30) == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)CONCAT44(fStack_2c,fStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x317,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_20.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_20.ptr_ + 8))();
      }
      local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&fStack_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ptr_._0_4_ = 5;
  auVar10._0_8_ =
       pbrt::SumSquares<float,pbrt::Interval<float>>
                 ((Interval<float>)0x3f8000003f800000,(Interval<float>)0x4000000040000000);
  auVar10._8_56_ = extraout_var;
  auVar12 = vhaddps_avx(auVar10._0_16_,auVar10._0_16_);
  local_40.data_._0_4_ = auVar12._0_4_ * 0.5;
  this_00 = (internal *)&local_38;
  testing::internal::CmpHelperEQ<int,float>
            (this_00,"5","Float(SumSquares(a, b))",(int *)&local_20,(float *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if ((undefined8 *)CONCAT44(fStack_2c,fStack_30) == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)CONCAT44(fStack_2c,fStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x318,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_20.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_20.ptr_ + 8))();
      }
      local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&fStack_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.data_._0_4_ = 1.96182e-44;
  auVar11._0_8_ =
       pbrt::SumSquares<float,pbrt::Interval<float>>
                 ((Interval<float>)0x4000000040000000,(Interval<float>)0x4040000040400000);
  auVar11._8_56_ = extraout_var_00;
  local_38._4_4_ = auVar11._0_4_ + 1.0;
  local_38._0_4_ = local_38._4_4_;
  fStack_30 = local_38._4_4_;
  fStack_2c = local_38._4_4_;
  lVar6 = 4;
  do {
    if (*(float *)((long)&local_38 + lVar6) < *(float *)this_00) {
      this_00 = (internal *)((long)&local_38 + lVar6);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  fVar5 = *(float *)this_00;
  if (-INFINITY < fVar5) {
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar12,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar5 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar5);
    fVar5 = (float)((int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2);
  }
  auVar12 = vmovshdup_avx(auVar11._0_16_);
  local_38._4_4_ = auVar12._0_4_ + 1.0;
  pfVar7 = (float *)&local_38;
  local_38._0_4_ = local_38._4_4_;
  fStack_30 = local_38._4_4_;
  fStack_2c = local_38._4_4_;
  lVar6 = 4;
  do {
    if (*pfVar7 < *(float *)((long)&local_38 + lVar6)) {
      pfVar7 = (float *)((long)&local_38 + lVar6);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  fVar8 = *pfVar7;
  if (fVar8 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
    fVar8 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar8);
    fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
  }
  auVar1 = vminss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar5));
  auVar12 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar5));
  auVar1 = vmaxss_avx(auVar1,ZEXT816(0));
  auVar2 = vminss_avx(auVar12,auVar1);
  auVar12 = vmaxss_avx(auVar12,auVar1);
  local_38._0_4_ = (auVar2._0_4_ + auVar12._0_4_) * 0.5;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_20,"14","Float(SumSquares(a, b, c))",(int *)&local_40,
             (float *)&local_38);
  if (local_20.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x319,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         )) {
        (**(code **)(*(long *)local_38 + 8))();
      }
      local_38 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FloatInterval, SumSquares) {
    {
        FloatInterval a(1), b(2), c(3);
        EXPECT_EQ(1, Float(SumSquares(a)));
        EXPECT_EQ(4, Float(SumSquares(b)));
        EXPECT_EQ(5, Float(SumSquares(a, b)));
        EXPECT_EQ(14, Float(SumSquares(a, b, c)));
    }
}